

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

void __thiscall
jsonnet::internal::ComprehensionSpec::ComprehensionSpec
          (ComprehensionSpec *this,Kind kind,Fodder *open_fodder,Fodder *var_fodder,Identifier *var,
          Fodder *in_fodder,AST *expr)

{
  this->kind = kind;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(&this->openFodder,open_fodder);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(&this->varFodder,var_fodder);
  this->var = var;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(&this->inFodder,in_fodder);
  this->expr = expr;
  return;
}

Assistant:

ComprehensionSpec(Kind kind, const Fodder &open_fodder, const Fodder &var_fodder,
                      const Identifier *var, const Fodder &in_fodder, AST *expr)
        : kind(kind),
          openFodder(open_fodder),
          varFodder(var_fodder),
          var(var),
          inFodder(in_fodder),
          expr(expr)
    {
    }